

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O1

Node * __thiscall M_tree::delete_one_leaf(M_tree *this,Node *tail)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  
  pNVar1 = tail->parent;
  do {
    pNVar2 = pNVar1;
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar1 = pNVar2->left;
    if ((tail != pNVar1) || (ppNVar3 = &pNVar2->left, pNVar2->right != (Node *)0x0)) {
      ppNVar3 = &pNVar2->right;
      if ((pNVar1 != (Node *)0x0) || (tail != pNVar2->right)) {
        if (tail == pNVar1) {
          pNVar2->left = (Node *)0x0;
        }
        if (tail == pNVar2->right) {
          *ppNVar3 = (Node *)0x0;
        }
        if (tail == (Node *)0x0) {
          return pNVar2;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tail->key);
        operator_delete(tail,0x50);
        return pNVar2;
      }
    }
    if (tail != (Node *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tail->key);
      operator_delete(tail,0x50);
    }
    *ppNVar3 = (Node *)0x0;
    pNVar1 = pNVar2->parent;
    tail = pNVar2;
  } while( true );
}

Assistant:

Node *M_tree::delete_one_leaf(Node *tail) {
    Node* up = tail->parent;
    while(up!=NULL){
        if(tail == up->left && up->right == NULL){
            delete(tail);
            tail = up;
            up->left = NULL;
        }
        else if(tail == up->right && up->left == NULL){
            delete(tail);
            tail = up;
            up->right = NULL;
        }
        else{
            if(tail == up->left){
                up->left = NULL;
            }
            if(tail == up->right){
                up->right = NULL;
            }
            delete(tail);
            return up;
        }
        up = tail->parent;
    }
    return NULL;
}